

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O2

double __thiscall icu_63::ChineseCalendar::daysToMillis(ChineseCalendar *this,double days)

{
  TimeZone *pTVar1;
  int32_t dstOffset;
  int32_t rawOffset;
  UErrorCode status;
  int local_20;
  int local_1c;
  double local_18;
  int local_c;
  
  local_18 = days * 86400000.0;
  pTVar1 = this->fZoneAstroCalc;
  if (pTVar1 != (TimeZone *)0x0) {
    local_c = 0;
    (*(pTVar1->super_UObject)._vptr_UObject[6])(pTVar1,0,&local_1c,&local_20,&local_c);
    if (local_c < 1) {
      return local_18 - (double)(local_20 + local_1c);
    }
  }
  return local_18 + -28800000.0;
}

Assistant:

double ChineseCalendar::daysToMillis(double days) const {
    double millis = days * (double)kOneDay;
    if (fZoneAstroCalc != NULL) {
        int32_t rawOffset, dstOffset;
        UErrorCode status = U_ZERO_ERROR;
        fZoneAstroCalc->getOffset(millis, FALSE, rawOffset, dstOffset, status);
        if (U_SUCCESS(status)) {
        	return millis - (double)(rawOffset + dstOffset);
        }
    }
    return millis - (double)CHINA_OFFSET;
}